

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcRoundedRectangleProfileDef::~IfcRoundedRectangleProfileDef
          (IfcRoundedRectangleProfileDef *this)

{
  ~IfcRoundedRectangleProfileDef
            ((IfcRoundedRectangleProfileDef *)
             &this[-1].super_IfcRectangleProfileDef.super_IfcParameterizedProfileDef.
              super_IfcProfileDef.ProfileName);
  return;
}

Assistant:

IfcRoundedRectangleProfileDef() : Object("IfcRoundedRectangleProfileDef") {}